

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

ConvertedFunction * __thiscall
dxil_spv::Converter::Impl::convert_entry_point(ConvertedFunction *__return_storage_ptr__,Impl *this)

{
  SPIRVModule *this_00;
  FILE *__stream;
  bool bVar1;
  ExecutionModel EVar2;
  uint uVar3;
  Module *module_00;
  MDNode *pMVar4;
  LoggingCallback p_Var5;
  char *pcVar6;
  void *pvVar7;
  type pool_00;
  Function *func_00;
  CFGNode *pCVar8;
  Function *pFVar9;
  MDNode *node;
  Function FVar10;
  byte local_23db;
  bool local_23da;
  bool local_23d9;
  char *local_23b8;
  undefined1 local_2388 [8];
  CFGStructurizer cfg_1;
  CFGStructurizer cfg;
  Function *local_2110;
  CFGNode *local_2108;
  Function *local_2100;
  CFGNode *local_20f8;
  Function *local_20f0;
  String local_20e8;
  Vector<LLVMBC::BasicBlock_*> local_20c8;
  undefined1 local_20b0 [8];
  Vector<LLVMBC::BasicBlock_*> patch_visit_order;
  Vector<LLVMBC::BasicBlock_*> visit_order;
  Function *func;
  bool need_bda;
  CFGNodePool *pool;
  uint32_t local_2060;
  uint32_t local_205c;
  uint32_t sm_minor;
  uint32_t sm_major;
  Builder *builder;
  char local_2048 [8];
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Module *module;
  Impl *this_local;
  ConvertedFunction *result;
  
  (__return_storage_ptr__->entry).entry = (CFGNode *)0x0;
  (__return_storage_ptr__->entry).func = (Function *)0x0;
  memset(&__return_storage_ptr__->leaf_functions,0,0x18);
  std::
  vector<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
  ::vector(&__return_storage_ptr__->leaf_functions);
  std::unique_ptr<dxil_spv::CFGNodePool,std::default_delete<dxil_spv::CFGNodePool>>::
  unique_ptr<std::default_delete<dxil_spv::CFGNodePool>,void>
            ((unique_ptr<dxil_spv::CFGNodePool,std::default_delete<dxil_spv::CFGNodePool>> *)
             &__return_storage_ptr__->node_pool);
  module_00 = LLVMBCParser::get_module(this->bitcode_parser);
  bVar1 = std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::empty
                    (&(this->options).entry_point);
  if (bVar1) {
    local_23b8 = (char *)0x0;
  }
  else {
    local_23b8 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
                 c_str(&(this->options).entry_point);
  }
  pMVar4 = get_entry_point_meta(module_00,local_23b8);
  this->entry_point_meta = pMVar4;
  EVar2 = get_execution_model(module_00,this->entry_point_meta);
  this->execution_model = EVar2;
  bVar1 = get_execution_model_lib_target(module_00,this->entry_point_meta);
  this->execution_model_lib_target = bVar1;
  if (((this->execution_model_lib_target & 1U) == 0) ||
     (this->execution_model != ExecutionModelGLCompute)) {
    if ((this->execution_model == ExecutionModelFragment) &&
       ((this->resource_mapping_iface != (ResourceRemappingInterface *)0x0 &&
        (uVar3 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[0xc])(),
        (uVar3 & 1) != 0)))) {
      SPIRVModule::set_override_spirv_version(this->spirv_module,0x10400);
    }
  }
  else {
    SPIRVModule::set_override_spirv_version(this->spirv_module,0x10600);
  }
  if (this->entry_point_meta == (MDNode *)0x0) {
    bVar1 = std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::empty
                      (&(this->options).entry_point);
    if (bVar1) {
      p_Var5 = get_thread_log_callback();
      if (p_Var5 != (LoggingCallback)0x0) {
        snprintf(local_2048,0x1000,"Could not find any entry point.\n");
        pvVar7 = get_thread_log_callback_userdata();
        (*p_Var5)(pvVar7,Error,local_2048);
        return __return_storage_ptr__;
      }
      fprintf(_stderr,"[ERROR]: Could not find any entry point.\n");
      fflush(_stderr);
      return __return_storage_ptr__;
    }
    p_Var5 = get_thread_log_callback();
    __stream = _stderr;
    if (p_Var5 != (LoggingCallback)0x0) {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
               c_str(&(this->options).entry_point);
      snprintf((char *)&cb_1,0x1000,"Could not find entry point \"%s\".\n",pcVar6);
      pvVar7 = get_thread_log_callback_userdata();
      (*p_Var5)(pvVar7,Error,(char *)&cb_1);
      return __return_storage_ptr__;
    }
    pcVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
             c_str(&(this->options).entry_point);
    fprintf(__stream,"[ERROR]: Could not find entry point \"%s\".\n",pcVar6);
    fflush(_stderr);
    return __return_storage_ptr__;
  }
  bVar1 = std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::empty
                    (&(this->options).shader_source_file);
  if (!bVar1) {
    _sm_minor = SPIRVModule::get_builder(this->spirv_module);
    local_205c = 0;
    local_2060 = 0;
    get_shader_model(module_00,(String *)0x0,&local_205c,&local_2060);
    spv::Builder::setSource(_sm_minor,SourceLanguageUnknown,local_205c * 100 + local_2060);
    spv::Builder::setSourceFile(_sm_minor,&(this->options).shader_source_file);
  }
  std::make_unique<dxil_spv::CFGNodePool>();
  std::unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>::operator=
            (&__return_storage_ptr__->node_pool,
             (unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_> *)&pool
            );
  std::unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>::~unique_ptr
            ((unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_> *)&pool
            );
  pool_00 = std::unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>::
            operator*(&__return_storage_ptr__->node_pool);
  local_23d9 = true;
  if (((this->options).physical_storage_buffer & 1U) == 0) {
    local_23da = false;
    if ((this->execution_model_lib_target & 1U) != 0) {
      local_23da = this->execution_model == ExecutionModelGLCompute;
    }
    local_23d9 = local_23da;
  }
  SPIRVModule::set_descriptor_qa_info(this->spirv_module,&(this->options).descriptor_qa);
  local_23db = 1;
  if (((this->options).min_precision_prefer_native_16bit & 1U) == 0) {
    local_23db = (this->execution_mode_meta).native_16bit_operations;
  }
  (this->options).instruction_instrumentation.fp16 = (bool)(local_23db & 1);
  SPIRVModule::set_instruction_instrumentation_info
            (this->spirv_module,&(this->options).instruction_instrumentation);
  this_00 = this->spirv_module;
  EVar2 = get_execution_model(module_00,this->entry_point_meta);
  SPIRVModule::emit_entry_point(this_00,EVar2,"main",local_23d9);
  func_00 = get_entry_point_function(this->entry_point_meta);
  build_function_bb_visit_order_legacy
            ((Vector<LLVMBC::BasicBlock_*> *)
             &patch_visit_order.
              super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,func_00,pool_00);
  std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::vector
            ((vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_> *)
             local_20b0);
  bVar1 = module_is_dxilconv(module_00);
  if (bVar1) {
    (this->options).min_precision_prefer_native_16bit = false;
  }
  bVar1 = analyze_execution_modes_meta(this);
  if ((((bVar1) && (bVar1 = emit_resources_global_mapping(this), bVar1)) &&
      (bVar1 = analyze_instructions(this,func_00), bVar1)) &&
     (bVar1 = emit_execution_modes(this), bVar1)) {
    if ((this->execution_mode_meta).patch_constant_function != (Function *)0x0) {
      build_function_bb_visit_order_legacy
                (&local_20c8,this,(this->execution_mode_meta).patch_constant_function,pool_00);
      std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
      operator=((vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                 *)local_20b0,&local_20c8);
      std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
      ~vector(&local_20c8);
      bVar1 = analyze_instructions(this,(this->execution_mode_meta).patch_constant_function);
      if (!bVar1) goto LAB_00134793;
    }
    bVar1 = emit_resources(this);
    if (((((bVar1) && (bVar1 = emit_stage_input_variables(this), bVar1)) &&
         ((bVar1 = emit_stage_output_variables(this), bVar1 &&
          ((bVar1 = emit_patch_variables(this), bVar1 && (bVar1 = emit_other_variables(this), bVar1)
           ))))) && (bVar1 = emit_global_variables(this), bVar1)) &&
       (bVar1 = emit_execution_modes_late(this), bVar1)) {
      analyze_instructions_post_execution_modes(this);
      get_entry_point_name_abi_cxx11_(&local_20e8,(dxil_spv *)this->entry_point_meta,node);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (&(this->execution_mode_meta).entry_point_name,&local_20e8);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string(&local_20e8);
      if (this->execution_model == ExecutionModelTessellationControl) {
        FVar10 = build_hull_main(this,(Vector<LLVMBC::BasicBlock_*> *)
                                      &patch_visit_order.
                                       super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (Vector<LLVMBC::BasicBlock_*> *)local_20b0,pool_00,
                                 &__return_storage_ptr__->leaf_functions);
        local_20f8 = FVar10.entry;
        (__return_storage_ptr__->entry).entry = local_20f8;
        local_20f0 = FVar10.func;
        (__return_storage_ptr__->entry).func = local_20f0;
      }
      else if (((this->execution_mode_meta).declares_rov & 1U) == 0) {
        if (((this->execution_model_lib_target & 1U) == 0) ||
           (this->execution_model != ExecutionModelGLCompute)) {
          pCVar8 = convert_function(this,(Vector<LLVMBC::BasicBlock_*> *)
                                         &patch_visit_order.
                                          super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
          (__return_storage_ptr__->entry).entry = pCVar8;
          if ((((this->shader_analysis).needs_auto_group_shared_barriers & 1U) != 0) &&
             (((this->options).quirks.group_shared_auto_barrier & 1U) != 0)) {
            CFGStructurizer::CFGStructurizer
                      ((CFGStructurizer *)&cfg_1.driver_id,(__return_storage_ptr__->entry).entry,
                       pool_00,this->spirv_module);
            CFGStructurizer::rewrite_auto_group_shared_barrier((CFGStructurizer *)&cfg_1.driver_id);
            CFGStructurizer::~CFGStructurizer((CFGStructurizer *)&cfg_1.driver_id);
          }
          if (((this->shader_analysis).require_subgroup_shuffles & 1U) != 0) {
            CFGStructurizer::CFGStructurizer
                      ((CFGStructurizer *)local_2388,(__return_storage_ptr__->entry).entry,pool_00,
                       this->spirv_module);
            CFGStructurizer::flatten_subgroup_shuffles((CFGStructurizer *)local_2388);
            CFGStructurizer::~CFGStructurizer((CFGStructurizer *)local_2388);
          }
          pFVar9 = SPIRVModule::get_entry_function(this->spirv_module);
          (__return_storage_ptr__->entry).func = pFVar9;
        }
        else {
          FVar10 = build_node_main(this,(Vector<LLVMBC::BasicBlock_*> *)
                                        &patch_visit_order.
                                         super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,pool_00,
                                   &__return_storage_ptr__->leaf_functions);
          cfg._304_8_ = FVar10.entry;
          (__return_storage_ptr__->entry).entry = (CFGNode *)cfg._304_8_;
          local_2110 = FVar10.func;
          (__return_storage_ptr__->entry).func = local_2110;
        }
      }
      else {
        FVar10 = build_rov_main(this,(Vector<LLVMBC::BasicBlock_*> *)
                                     &patch_visit_order.
                                      super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pool_00,
                                &__return_storage_ptr__->leaf_functions);
        local_2108 = FVar10.entry;
        (__return_storage_ptr__->entry).entry = local_2108;
        local_2100 = FVar10.func;
        (__return_storage_ptr__->entry).func = local_2100;
      }
      emit_execution_modes_post_code_generation(this);
    }
  }
LAB_00134793:
  builder._4_4_ = 1;
  std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::~vector
            ((vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_> *)
             local_20b0);
  std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::~vector
            ((vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_> *)
             &patch_visit_order.
              super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

ConvertedFunction Converter::Impl::convert_entry_point()
{
	ConvertedFunction result = {};

	auto &module = bitcode_parser.get_module();
	entry_point_meta = get_entry_point_meta(module, options.entry_point.empty() ? nullptr : options.entry_point.c_str());
	execution_model = get_execution_model(module, entry_point_meta);
	execution_model_lib_target = get_execution_model_lib_target(module, entry_point_meta);

	if (execution_model_lib_target && execution_model == spv::ExecutionModelGLCompute)
	{
		// Might as well go with SPIR-V 1.6. Then we get subgroup size control semantics for "free".
		// When we're willing to do a clean break with Fossilize all shaders should target SPIR-V 1.6.
		spirv_module.set_override_spirv_version(0x10600);
	}
	else if (execution_model == spv::ExecutionModelFragment &&
	         resource_mapping_iface && resource_mapping_iface->has_nontrivial_stage_input_remapping())
	{
		// Force SPIR-V 1.4 for fragment shaders if we might end up requiring mesh shader capabilities.
		// Non-trivial stage input remapping may require PerPrimitiveEXT decoration.
		spirv_module.set_override_spirv_version(0x10400);
	}

	if (!entry_point_meta)
	{
		if (!options.entry_point.empty())
			LOGE("Could not find entry point \"%s\".\n", options.entry_point.c_str());
		else
			LOGE("Could not find any entry point.\n");
		return result;
	}

	if (!options.shader_source_file.empty())
	{
		auto &builder = spirv_module.get_builder();
		uint32_t sm_major = 0, sm_minor = 0;
		get_shader_model(module, nullptr, &sm_major, &sm_minor);
		builder.setSource(spv::SourceLanguageUnknown, sm_major * 100 + sm_minor);
		builder.setSourceFile(options.shader_source_file);
	}

	result.node_pool = std::make_unique<CFGNodePool>();
	auto &pool = *result.node_pool;

	bool need_bda =
		options.physical_storage_buffer ||
		(execution_model_lib_target &&
		 execution_model == spv::ExecutionModelGLCompute);

	spirv_module.set_descriptor_qa_info(options.descriptor_qa);
	options.instruction_instrumentation.fp16 =
	    options.min_precision_prefer_native_16bit || execution_mode_meta.native_16bit_operations;
	spirv_module.set_instruction_instrumentation_info(options.instruction_instrumentation);
	spirv_module.emit_entry_point(get_execution_model(module, entry_point_meta), "main", need_bda);

	llvm::Function *func = get_entry_point_function(entry_point_meta);
	auto visit_order = build_function_bb_visit_order_legacy(func, pool);
	Vector<llvm::BasicBlock *> patch_visit_order;

	// dxilconv emits somewhat broken code for min16float for resource access.
	// Just use FP32 here since that's what we've tested and avoids lots of awkward workarounds.
	if (module_is_dxilconv(module))
		options.min_precision_prefer_native_16bit = false;

	// Need to analyze some execution modes early which affect opcode analysis later.
	if (!analyze_execution_modes_meta())
		return result;
	if (!emit_resources_global_mapping())
		return result;
	if (!analyze_instructions(func))
		return result;

	if (!emit_execution_modes())
		return result;

	if (execution_mode_meta.patch_constant_function)
	{
		patch_visit_order = build_function_bb_visit_order_legacy(execution_mode_meta.patch_constant_function, pool);
		if (!analyze_instructions(execution_mode_meta.patch_constant_function))
			return result;
	}

	if (!emit_resources())
		return result;
	if (!emit_stage_input_variables())
		return result;
	if (!emit_stage_output_variables())
		return result;
	if (!emit_patch_variables())
		return result;
	if (!emit_other_variables())
		return result;
	if (!emit_global_variables())
		return result;

	// Some execution modes depend on other execution modes, so handle that here.
	if (!emit_execution_modes_late())
		return result;

	analyze_instructions_post_execution_modes();

	execution_mode_meta.entry_point_name = get_entry_point_name(entry_point_meta);

	if (execution_model == spv::ExecutionModelTessellationControl)
		result.entry = build_hull_main(visit_order, patch_visit_order, pool, result.leaf_functions);
	else if (execution_mode_meta.declares_rov)
		result.entry = build_rov_main(visit_order, pool, result.leaf_functions);
	else if (execution_model_lib_target && execution_model == spv::ExecutionModelGLCompute)
		result.entry = build_node_main(visit_order, pool, result.leaf_functions);
	else
	{
		result.entry.entry = convert_function(visit_order, true);
		if (shader_analysis.needs_auto_group_shared_barriers && options.quirks.group_shared_auto_barrier)
		{
			CFGStructurizer cfg{result.entry.entry, pool, spirv_module};
			cfg.rewrite_auto_group_shared_barrier();
		}

		if (shader_analysis.require_subgroup_shuffles)
		{
			CFGStructurizer cfg{result.entry.entry, pool, spirv_module};
			cfg.flatten_subgroup_shuffles();
		}

		result.entry.func = spirv_module.get_entry_function();
	}

	// Some execution modes depend on code generation, handle that here.
	emit_execution_modes_post_code_generation();

	return result;
}